

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregocal.cpp
# Opt level: O1

int32_t __thiscall
icu_63::GregorianCalendar::getActualMaximum
          (GregorianCalendar *this,UCalendarDateFields field,UErrorCode *status)

{
  int iVar1;
  int iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  undefined4 extraout_var;
  int value;
  double millis;
  Calendar *this_00;
  
  if (field == UCAL_YEAR) {
    iVar5 = 0;
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      iVar2 = (*(this->super_Calendar).super_UObject._vptr_UObject[3])();
      this_00 = (Calendar *)CONCAT44(extraout_var,iVar2);
      if (this_00 == (Calendar *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        iVar5 = 0;
      }
      else {
        iVar5 = 1;
        Calendar::setLenient(this_00,'\x01');
        iVar3 = Calendar::get(this_00,UCAL_ERA,status);
        millis = Calendar::getTimeInMillis(this_00,status);
        iVar2 = 0x225c7;
        do {
          value = (iVar5 + iVar2) / 2;
          Calendar::set(this_00,UCAL_YEAR,value);
          iVar4 = Calendar::get(this_00,UCAL_YEAR,status);
          if ((iVar4 != value) ||
             (iVar4 = Calendar::get(this_00,UCAL_ERA,status), iVar1 = value, iVar4 != iVar3)) {
            Calendar::setTimeInMillis(this_00,millis,status);
            iVar1 = iVar5;
            iVar2 = value;
          }
          iVar5 = iVar1;
        } while (iVar5 + 1 < iVar2);
        (*(this_00->super_UObject)._vptr_UObject[1])(this_00);
      }
    }
    return iVar5;
  }
  iVar5 = Calendar::getActualMaximum(&this->super_Calendar,field,status);
  return iVar5;
}

Assistant:

int32_t GregorianCalendar::getActualMaximum(UCalendarDateFields field, UErrorCode& status) const
{
    /* It is a known limitation that the code here (and in getActualMinimum)
    * won't behave properly at the extreme limits of GregorianCalendar's
    * representable range (except for the code that handles the YEAR
    * field).  That's because the ends of the representable range are at
    * odd spots in the year.  For calendars with the default Gregorian
    * cutover, these limits are Sun Dec 02 16:47:04 GMT 292269055 BC to Sun
    * Aug 17 07:12:55 GMT 292278994 AD, somewhat different for non-GMT
    * zones.  As a result, if the calendar is set to Aug 1 292278994 AD,
    * the actual maximum of DAY_OF_MONTH is 17, not 30.  If the date is Mar
    * 31 in that year, the actual maximum month might be Jul, whereas is
    * the date is Mar 15, the actual maximum might be Aug -- depending on
    * the precise semantics that are desired.  Similar considerations
    * affect all fields.  Nonetheless, this effect is sufficiently arcane
    * that we permit it, rather than complicating the code to handle such
    * intricacies. - liu 8/20/98

    * UPDATE: No longer true, since we have pulled in the limit values on
    * the year. - Liu 11/6/00 */

    switch (field) {

    case UCAL_YEAR:
        /* The year computation is no different, in principle, from the
        * others, however, the range of possible maxima is large.  In
        * addition, the way we know we've exceeded the range is different.
        * For these reasons, we use the special case code below to handle
        * this field.
        *
        * The actual maxima for YEAR depend on the type of calendar:
        *
        *     Gregorian = May 17, 292275056 BC - Aug 17, 292278994 AD
        *     Julian    = Dec  2, 292269055 BC - Jan  3, 292272993 AD
        *     Hybrid    = Dec  2, 292269055 BC - Aug 17, 292278994 AD
        *
        * We know we've exceeded the maximum when either the month, date,
        * time, or era changes in response to setting the year.  We don't
        * check for month, date, and time here because the year and era are
        * sufficient to detect an invalid year setting.  NOTE: If code is
        * added to check the month and date in the future for some reason,
        * Feb 29 must be allowed to shift to Mar 1 when setting the year.
        */
        {
            if(U_FAILURE(status)) return 0;
            Calendar *cal = clone();
            if(!cal) {
                status = U_MEMORY_ALLOCATION_ERROR;
                return 0;
            }

            cal->setLenient(TRUE);

            int32_t era = cal->get(UCAL_ERA, status);
            UDate d = cal->getTime(status);

            /* Perform a binary search, with the invariant that lowGood is a
            * valid year, and highBad is an out of range year.
            */
            int32_t lowGood = kGregorianCalendarLimits[UCAL_YEAR][1];
            int32_t highBad = kGregorianCalendarLimits[UCAL_YEAR][2]+1;
            while ((lowGood + 1) < highBad) {
                int32_t y = (lowGood + highBad) / 2;
                cal->set(UCAL_YEAR, y);
                if (cal->get(UCAL_YEAR, status) == y && cal->get(UCAL_ERA, status) == era) {
                    lowGood = y;
                } else {
                    highBad = y;
                    cal->setTime(d, status); // Restore original fields
                }
            }

            delete cal;
            return lowGood;
        }

    default:
        return Calendar::getActualMaximum(field,status);
    }
}